

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_1,_1>::calcEdgeLogLikelihoods
          (BeagleCPUSSEImpl<double,_1,_1> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  int iVar1;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a4;
  int in_stack_000000a8;
  int in_stack_000000ac;
  BeagleCPUImpl<double,_1,_1> *in_stack_000000b0;
  int in_stack_000000c0;
  double *in_stack_000000c8;
  
  iVar1 = BeagleCPUImpl<double,_1,_1>::calcEdgeLogLikelihoods
                    (in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,in_stack_000000a4,
                     in_stack_000000a0,in_stack_0000009c,in_stack_000000c0,in_stack_000000c8);
  return iVar1;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
int BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
return BeagleCPUImpl<BEAGLE_CPU_SSE_DOUBLE>::calcEdgeLogLikelihoods(
                                                    parIndex,
                                                    childIndex,
                                                    probIndex,
                                                    categoryWeightsIndex,
                                                    stateFrequenciesIndex,
                                                    scalingFactorsIndex,
                                                    outSumLogLikelihood);
}